

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall
Hpipe::Instruction::optimize_conditions
          (Instruction *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  bool bVar1;
  reference pTVar2;
  Transition *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Transition> *__range1;
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  Instruction *this_local;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    __end1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                       (&(this->next).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t = (Transition *)
        std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                  (&(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                  );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                       *)&t), bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
               ::operator*(&__end1);
      (*pTVar2->inst->_vptr_Instruction[0xe])(pTVar2->inst,inst_pool);
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Instruction::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}